

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

string * __thiscall
chaiscript::exception::eval_error::format_detail_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_functions,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  eval_error *peVar1;
  ostream *poVar2;
  eval_error *this_00;
  stringstream ss;
  char local_1e1;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (*(long *)&this->field_0x8 - (long)*(long **)this == 0x10) {
    if (**(long **)this == 0) {
      __assert_fail("t_functions[0]",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/chaiscript_common.hpp"
                    ,0x1d4,
                    "static std::string chaiscript::exception::eval_error::format_detail(const std::vector<chaiscript::Const_Proxy_Function> &, bool, const chaiscript::detail::Dispatch_Engine &)"
                   );
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  Expected: ",0xc);
    format_types_abi_cxx11_
              (&local_1e0,*(eval_error **)this,(Const_Proxy_Function *)((ulong)t_functions & 0xff),
               t_dot_notation,t_ss);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    local_1e1 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e1,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  ",2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," overloads available:\n",0x16);
    this_00 = *(eval_error **)this;
    peVar1 = *(eval_error **)&this->field_0x8;
    if (this_00 != peVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"      ",6);
        format_types_abi_cxx11_
                  (&local_1e0,this_00,(Const_Proxy_Function *)((ulong)t_functions & 0xff),
                   t_dot_notation,t_ss);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        local_1e1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e1,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        this_00 = (eval_error *)&this_00->reason;
      } while (this_00 != peVar1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1c0;
}

Assistant:

static std::string format_detail(const std::vector<chaiscript::Const_Proxy_Function> &t_functions,
                                       bool t_dot_notation,
                                       const chaiscript::detail::Dispatch_Engine &t_ss) {
        std::stringstream ss;
        if (t_functions.size() == 1) {
          assert(t_functions[0]);
          ss << "  Expected: " << format_types(t_functions[0], t_dot_notation, t_ss) << '\n';
        } else {
          ss << "  " << t_functions.size() << " overloads available:\n";

          for (const auto &t_function : t_functions) {
            ss << "      " << format_types((t_function), t_dot_notation, t_ss) << '\n';
          }
        }

        return ss.str();
      }